

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::transform
          (LightNodeImpl<embree::SceneGraph::TriangleLight> *this,AffineSpace3fa *space)

{
  LightNodeImpl<embree::SceneGraph::TriangleLight> *this_00;
  AffineSpace3fa *in_RDX;
  TriangleLight TStack_78;
  
  this_00 = (LightNodeImpl<embree::SceneGraph::TriangleLight> *)operator_new(0xc0);
  TriangleLight::transform((TriangleLight *)&space[1].p,in_RDX);
  LightNodeImpl(this_00,&TStack_78);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }